

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::Utils::program::uniform
          (program *this,GLchar *uniform_name,TYPES type,GLuint n_columns,GLuint n_rows,void *data)

{
  int iVar1;
  GLint GVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  uniformNdv p_Var6;
  uniformMatrixNdv p_Var7;
  uniformNfv p_Var8;
  uniformMatrixNfv p_Var9;
  uniformNiv p_Var10;
  uniformNuiv p_Var11;
  GLuint location;
  Functions *gl;
  void *data_local;
  GLuint n_rows_local;
  GLuint n_columns_local;
  TYPES type_local;
  GLchar *uniform_name_local;
  program *this_local;
  Functions *gl_00;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  GVar2 = getUniformLocation(this,uniform_name);
  if (GVar2 != -1) {
    switch(type) {
    case FLOAT:
      if (n_columns == 1) {
        p_Var8 = getUniformNfv(gl_00,n_rows);
        (*p_Var8)(GVar2,1,(GLfloat *)data);
        GVar3 = (*gl_00->getError)();
        glu::checkError(GVar3,"UniformNfv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                        ,0x47ac);
      }
      else {
        p_Var9 = getUniformMatrixNfv(gl_00,n_columns,n_rows);
        (*p_Var9)(GVar2,1,'\0',(GLfloat *)data);
        GVar3 = (*gl_00->getError)();
        glu::checkError(GVar3,"UniformMatrixNfv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                        ,0x47b1);
      }
      break;
    case DOUBLE:
      if (n_columns == 1) {
        p_Var6 = getUniformNdv(gl_00,n_rows);
        (*p_Var6)(GVar2,1,(GLdouble *)data);
        GVar3 = (*gl_00->getError)();
        glu::checkError(GVar3,"UniformNdv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                        ,0x47a0);
      }
      else {
        p_Var7 = getUniformMatrixNdv(gl_00,n_columns,n_rows);
        (*p_Var7)(GVar2,1,'\0',(GLdouble *)data);
        GVar3 = (*gl_00->getError)();
        glu::checkError(GVar3,"UniformMatrixNdv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                        ,0x47a5);
      }
      break;
    case INT:
      p_Var10 = getUniformNiv(gl_00,n_rows);
      (*p_Var10)(GVar2,1,(GLint *)data);
      GVar3 = (*gl_00->getError)();
      glu::checkError(GVar3,"UniformNiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                      ,0x47b6);
      break;
    case UINT:
      p_Var11 = getUniformNuiv(gl_00,n_rows);
      (*p_Var11)(GVar2,1,(GLuint *)data);
      GVar3 = (*gl_00->getError)();
      glu::checkError(GVar3,"UniformNuiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                      ,0x47ba);
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                 ,0x47bd);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    return;
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Uniform is inactive",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x4797);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void Utils::program::uniform(const glw::GLchar* uniform_name, TYPES type, glw::GLuint n_columns, glw::GLuint n_rows,
							 const void* data) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLuint location = getUniformLocation(uniform_name);

	if ((glw::GLuint)-1 == location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	switch (type)
	{
	case DOUBLE:
		if (1 == n_columns)
		{
			getUniformNdv(gl, n_rows)(location, 1 /* count */, (const GLdouble*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNdv");
		}
		else
		{
			getUniformMatrixNdv(gl, n_columns, n_rows)(location, 1 /* count */, false, (const GLdouble*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformMatrixNdv");
		}
		break;
	case FLOAT:
		if (1 == n_columns)
		{
			getUniformNfv(gl, n_rows)(location, 1 /* count */, (const GLfloat*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNfv");
		}
		else
		{
			getUniformMatrixNfv(gl, n_columns, n_rows)(location, 1 /* count */, false, (const GLfloat*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformMatrixNfv");
		}
		break;
	case INT:
		getUniformNiv(gl, n_rows)(location, 1 /* count */, (const GLint*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNiv");
		break;
	case UINT:
		getUniformNuiv(gl, n_rows)(location, 1 /* count */, (const GLuint*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNuiv");
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}